

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O3

SLabelTableEntry *
SearchLabel(char **p,bool setUsed,unique_ptr<char[],_std::default_delete<char[]>_> *fullName)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  SLabelTableEntry *pSVar6;
  bool bVar7;
  char p_00;
  char *pcVar8;
  SLabelTableEntry *pSVar10;
  byte *pbVar9;
  
  getLabel_invalidName = 1;
  pcVar4 = ValidateLabel(*p,false,true);
  pcVar8 = (fullName->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
  (fullName->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = pcVar4;
  if (pcVar8 != (char *)0x0) {
    operator_delete__(pcVar8);
    pcVar4 = (fullName->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
  }
  if (pcVar4 == (char *)0x0) {
    return (SLabelTableEntry *)0x0;
  }
  getLabel_invalidName = 0;
  cVar1 = **p;
  p_00 = cVar1;
  while (iVar3 = islabchar(p_00), iVar3 != 0) {
    pcVar8 = *p;
    *p = pcVar8 + 1;
    p_00 = pcVar8[1];
  }
  bVar7 = macrolabp != (char *)0x0 && cVar1 == '.';
  sVar5 = strlen(ModuleName);
  pcVar8 = (fullName->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
  temp[0] = '\0';
  iVar3 = (int)sVar5;
  pSVar10 = (SLabelTableEntry *)0x0;
  while( true ) {
    while( true ) {
      pSVar6 = CLabelTable::Find(&LabelTable,pcVar8,false);
      if (pSVar6 != (SLabelTableEntry *)0x0) {
        if ((setUsed) && (pass < 3)) {
          pSVar6->used = true;
        }
        pSVar10 = pSVar6;
        if (pSVar6->page != -1) {
          return pSVar6;
        }
      }
      pbVar9 = (byte *)pcVar8;
      if (!bVar7) break;
      do {
        pcVar8 = (char *)(pbVar9 + 1);
        bVar2 = *pbVar9;
        pbVar9 = (byte *)pcVar8;
      } while ((bVar2 | 0x10) != 0x3e);
      bVar7 = true;
      if (bVar2 == 0x3e) {
        if (iVar3 != 0) {
          strncat(temp,ModuleName,0x7fe);
          sVar5 = strlen(temp);
          (temp + sVar5)[0] = '.';
          (temp + sVar5)[1] = '\0';
        }
        strncat(temp,vorlabp,0x3f);
        sVar5 = strlen(temp);
        (temp + sVar5)[0] = '.';
        (temp + sVar5)[1] = '\0';
        strncat(temp,pcVar8,0x3f);
        bVar7 = false;
        pcVar8 = temp;
      }
    }
    if (cVar1 == '.') {
      return pSVar10;
    }
    if (cVar1 == '@') break;
    pbVar9 = (byte *)(fullName->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
                     .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl;
    if (pbVar9 != (byte *)pcVar8) {
      return pSVar10;
    }
    if (iVar3 == 0) {
      return pSVar10;
    }
    pcVar8 = (char *)(pbVar9 + (long)iVar3 + 1);
    bVar7 = false;
  }
  return pSVar10;
}

Assistant:

static SLabelTableEntry* SearchLabel(char*& p, bool setUsed, /*out*/ std::unique_ptr<char[]>& fullName) {
	getLabel_invalidName = true;
	fullName.reset(ValidateLabel(p, false, true));
	if (!fullName) return nullptr;
	getLabel_invalidName = false;
	const bool global = '@' == *p;
	const bool local = '.' == *p;
	while (islabchar(*p)) ++p;		// advance pointer beyond the parsed label
	// find the label entry in the label table (for local macro labels it has to try all sub-parts!)
	// then regular full label has to be tried
	// and if it's regular non-local in module, then variant w/o current module has to be tried
	bool inMacro = local && macrolabp;		// not just inside macro, but should be prefixed
	const int modNameLen = strlen(ModuleName);
	const char *findName = fullName.get();
	SLabelTableEntry* undefinedLabelEntry = nullptr;
	SLabelTableEntry* labelEntry = nullptr;
	temp[0] = 0;
	do {
		labelEntry = LabelTable.Find(findName);
		if (labelEntry) {
			if (setUsed && pass < LASTPASS) labelEntry->used = true;
			if (LABEL_PAGE_UNDEFINED != labelEntry->page) return labelEntry;	// found
			// if found, but "undefined" one, remember it as fall-back result
			undefinedLabelEntry = labelEntry;
			labelEntry = nullptr;
		}
		// not found (the defined one, try more variants)
		if (inMacro) {				// try outer macro (if there is one)
			while ('>' != *findName && '.' != *findName) ++findName;
			// if no more outer macros, try module+non-local prefix with the original local label
			if ('>' == *findName++) {
				inMacro = false;
				if (modNameLen) {
					#pragma GCC diagnostic push	// disable gcc8 warning about truncation - that's intended behaviour
					#if 8 <= __GNUC__
						#pragma GCC diagnostic ignored "-Wstringop-truncation"
					#endif
					STRCAT(temp, LINEMAX-2, ModuleName); STRCAT(temp, 2, ".");
					#pragma GCC diagnostic pop
				}
				STRCAT(temp, LABMAX-1, vorlabp); STRCAT(temp, 2, ".");
				STRCAT(temp, LABMAX-1, findName);
				findName = temp;
			}
		} else {
			if (!global && !local && fullName.get() == findName && modNameLen) {
				// this still may be global label without current module (but author didn't use "@")
				findName = fullName.get() + modNameLen + 1;
			} else {
				findName = nullptr;	// all options exhausted
			}
		}
	} while (findName);
	return undefinedLabelEntry;
}